

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall
cp::PlanFootprints::init_setup
          (PlanFootprints *this,Affine3d *init_leg_pose,Quat *waist_q,Vector3 *com,double *endcpoff)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  Scalar local_178;
  Scalar local_170;
  Scalar local_168;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_160;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_130;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_110;
  RotationReturnType local_f0;
  undefined1 local_a8 [8];
  Quat q;
  ConstTranslationPart local_80;
  undefined1 local_50 [8];
  Vector3 trans;
  int i;
  double *endcpoff_local;
  Vector3 *com_local;
  Quat *waist_q_local;
  Affine3d *init_leg_pose_local;
  PlanFootprints *this_local;
  
  for (trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
       _4_4_ = 0;
      trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _4_4_ < 2;
      trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _4_4_ = trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]._4_4_ + 1) {
    Eigen::Transform<double,_3,_2,_0>::translation
              (&local_80,
               init_leg_pose +
               trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[2]._4_4_);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,3,1,true>>
              ((Matrix<double,3,1,0,3,1> *)local_50,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> *)
               &local_80);
    Eigen::Transform<double,_3,_2,_0>::rotation
              (&local_f0,
               init_leg_pose +
               trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[2]._4_4_);
    Eigen::Quaternion<double,0>::Quaternion<Eigen::Matrix<double,3,3,0,3,3>>
              ((Quaternion<double,0> *)local_a8,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_f0);
    Pose::set((Pose *)(this + (long)trans.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2]._4_4_ * 0xe0 + 0x310),
              (Vector3 *)local_50,(Quat *)local_a8);
    Pose::set((Pose *)(this + (long)trans.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2]._4_4_ * 0xe0 + 0x10),
              (Pose *)(this + (long)trans.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2]._4_4_ * 0xe0 + 0x310));
    Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
              (&local_110,
               (DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (this + (long)trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2]._4_4_ * 0x18 + 0x4d8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_50);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_110);
  }
  Pose::set((Pose *)(this + 0x1d0),com,waist_q);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)com,0);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_130,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this + 0x2d0),pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)com,1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_130,pdVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_130);
  *(double *)(this + 0x508) = *endcpoff;
  *(double *)(this + 0x510) = endcpoff[1];
  local_168 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_160,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(this + 0x2e8),
             &local_168);
  local_170 = 0.0;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_160,&local_170);
  local_178 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this_00,&local_178);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_160);
  *(undefined8 *)(this + 0x300) = 0;
  *(undefined4 *)(this + 0x4d0) = 0;
  return;
}

Assistant:

void PlanFootprints::init_setup(const Affine3d init_leg_pose[],
                                const Quat& waist_q, const Vector3& com,
                                const double endcpoff[]) {
  for (int i = 0; i < 2; ++i) {
    Vector3 trans = init_leg_pose[i].translation();
    Quat q(init_leg_pose[i].rotation());
    init_feet_pose[i].set(trans, q);
    ref_land_pose[i].set(init_feet_pose[i]);
    dist_body2foot[i] << trans;  // TODO! subtraction to body position
  }
  ref_waist_pose.set(com, waist_q);
  // ref_waist_r = waist_r;
  end_cp << com[0], com[1];
  end_cp_offset[0] = endcpoff[0];  end_cp_offset[1] = endcpoff[1];
  step_vector << 0.0, 0.0, 0.0;
  step_angle = 0.0;
  step_num = 0;
}